

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O0

string * getEnvImpl_abi_cxx11_(char *name)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  char *result;
  allocator local_2d [20];
  allocator local_19;
  char *local_18;
  
  pcVar1 = getenv(in_RSI);
  local_18 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return in_RDI;
}

Assistant:

std::string getEnvImpl(const char *name)
{
    #ifdef _MSC_VER
    const DWORD len = GetEnvironmentVariableA(name, 0, 0);
    if (len == 0) return "";
    char* buffer = new char[len];
    GetEnvironmentVariableA(name, buffer, len);
    std::string result(buffer);
    delete [] buffer;
    return result;
    #else
    const char *result = getenv(name);
    if (result != NULL) return result;
    #endif
    return "";
}